

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_qualified_member_name_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [34];
  byte local_7e;
  allocator local_7d [13];
  string local_70 [32];
  long local_50;
  size_t startPos;
  string mbr_name;
  BuiltIn local_28 [2];
  BuiltIn builtin;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  _builtin = (SPIRType *)CONCAT44(in_register_00000014,index);
  local_28[0] = BuiltInMax;
  type_local = type;
  this_local = this;
  bVar1 = Compiler::is_member_builtin((Compiler *)type,_builtin,in_ECX,local_28);
  if (bVar1) {
    (*(type->super_IVariant)._vptr_IVariant[0x14])
              (this,type,(ulong)local_28[0],(ulong)_builtin->storage);
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)&startPos,type,(uint32_t)_builtin);
    local_50 = ::std::__cxx11::string::find_first_not_of((char *)&startPos,0x4e3b4c);
    local_7e = 0;
    if (local_50 == -1) {
      ::std::allocator<char>::allocator();
      local_7e = 1;
      ::std::__cxx11::string::string(local_70,"",local_7d);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_70,(ulong)&startPos);
    }
    ::std::__cxx11::string::operator=((string *)&startPos,local_70);
    ::std::__cxx11::string::~string(local_70);
    if ((local_7e & 1) != 0) {
      ::std::allocator<char>::~allocator((allocator<char> *)local_7d);
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_builtin->super_IVariant).self);
    (*(type->super_IVariant)._vptr_IVariant[6])(local_a0,type,(ulong)uVar2,1);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              ((spirv_cross *)this,local_a0,(char (*) [2])0x4e3b4c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&startPos);
    ::std::__cxx11::string::~string((string *)local_a0);
    ::std::__cxx11::string::~string((string *)&startPos);
  }
  return this;
}

Assistant:

string CompilerMSL::to_qualified_member_name(const SPIRType &type, uint32_t index)
{
	// Don't qualify Builtin names because they are unique and are treated as such when building expressions
	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
		return builtin_to_glsl(builtin, type.storage);

	// Strip any underscore prefix from member name
	string mbr_name = to_member_name(type, index);
	size_t startPos = mbr_name.find_first_not_of("_");
	mbr_name = (startPos != string::npos) ? mbr_name.substr(startPos) : "";
	return join(to_name(type.self), "_", mbr_name);
}